

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mmu_factory.cpp
# Opt level: O1

unique_ptr<n_e_s::core::IMmu,_std::default_delete<n_e_s::core::IMmu>_>
n_e_s::core::MmuFactory::create_empty(void)

{
  pointer __p;
  undefined8 *puVar1;
  __uniq_ptr_data<n_e_s::core::IMmu,_std::default_delete<n_e_s::core::IMmu>,_true,_true> in_RDI;
  __uniq_ptr_impl<n_e_s::core::Mmu,_std::default_delete<n_e_s::core::Mmu>_> local_10;
  
  puVar1 = (undefined8 *)operator_new(0x20);
  *puVar1 = 0;
  puVar1[1] = 0;
  puVar1[2] = 0;
  puVar1[3] = 0;
  *puVar1 = &PTR__Mmu_001329d0;
  puVar1[1] = 0;
  puVar1[2] = 0;
  puVar1[3] = 0;
  local_10._M_t.super__Tuple_impl<0UL,_n_e_s::core::Mmu_*,_std::default_delete<n_e_s::core::Mmu>_>.
  super__Head_base<0UL,_n_e_s::core::Mmu_*,_false>._M_head_impl =
       (tuple<n_e_s::core::Mmu_*,_std::default_delete<n_e_s::core::Mmu>_>)
       (_Tuple_impl<0UL,_n_e_s::core::Mmu_*,_std::default_delete<n_e_s::core::Mmu>_>)0x0;
  *(undefined8 **)
   in_RDI.super___uniq_ptr_impl<n_e_s::core::IMmu,_std::default_delete<n_e_s::core::IMmu>_>._M_t.
   super__Tuple_impl<0UL,_n_e_s::core::IMmu_*,_std::default_delete<n_e_s::core::IMmu>_>.
   super__Head_base<0UL,_n_e_s::core::IMmu_*,_false>._M_head_impl = puVar1;
  std::unique_ptr<n_e_s::core::Mmu,_std::default_delete<n_e_s::core::Mmu>_>::~unique_ptr
            ((unique_ptr<n_e_s::core::Mmu,_std::default_delete<n_e_s::core::Mmu>_> *)&local_10);
  return (__uniq_ptr_data<n_e_s::core::IMmu,_std::default_delete<n_e_s::core::IMmu>,_true,_true>)
         (tuple<n_e_s::core::IMmu_*,_std::default_delete<n_e_s::core::IMmu>_>)
         in_RDI.super___uniq_ptr_impl<n_e_s::core::IMmu,_std::default_delete<n_e_s::core::IMmu>_>.
         _M_t.super__Tuple_impl<0UL,_n_e_s::core::IMmu_*,_std::default_delete<n_e_s::core::IMmu>_>.
         super__Head_base<0UL,_n_e_s::core::IMmu_*,_false>._M_head_impl;
}

Assistant:

std::unique_ptr<IMmu> MmuFactory::create_empty() {
    return std::make_unique<Mmu>();
}